

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryReader::readTags(WasmBinaryReader *this)

{
  char *pcVar1;
  HeapType HVar2;
  size_t sVar3;
  uint32_t uVar4;
  ostream *poVar5;
  char *pcVar6;
  __node_base_ptr *prefix;
  _Hash_node_base *p_Var7;
  WasmBinaryReader *this_00;
  size_t counter;
  Name NVar8;
  Signature sig;
  Name name;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_ffffffffffffff28;
  undefined1 local_d0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  __node_base local_88 [2];
  HeapType local_78;
  wasm *local_70;
  pair<wasm::Name,_bool> local_68;
  WasmBinaryReader *local_50;
  char *local_48;
  ulong local_40;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  
  uVar4 = getU32LEB(this);
  local_40 = (ulong)uVar4;
  pcVar6 = (char *)((long)(this->wasm->tags).
                          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->wasm->tags).
                          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_d0 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var7 = (this->tagNames)._M_h._M_before_begin._M_nxt;
  local_50 = this;
  local_48 = pcVar6;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    pcVar1 = pcVar6 + local_40;
    do {
      if (pcVar1 <= (char *)(ulong)*(uint *)&p_Var7[1]._M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: tag index out of bounds in name section: ",0x32);
        NVar8.super_IString.str._M_str = pcVar6;
        NVar8.super_IString.str._M_len = (size_t)p_Var7[3]._M_nxt;
        poVar5 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var7[2]._M_nxt,NVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," at index ",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        local_68.first.super_IString.str._M_len =
             CONCAT71(local_68.first.super_IString.str._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_68,1);
      }
      local_68.first.super_IString.str._M_len = (size_t)local_d0;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_d0,p_Var7 + 2,&local_68);
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  if (local_40 != 0) {
    local_70 = (wasm *)&local_50->tagNames;
    counter = 0;
    this_00 = local_50;
    do {
      prefix = &usedNames._M_h._M_single_bucket;
      getInt8(this_00);
      usedNames._M_h._M_single_bucket = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)prefix,"tag$","");
      NVar8 = makeName((string *)prefix,counter);
      name.super_IString.str._M_str = local_d0;
      name.super_IString.str._M_len = (size_t)NVar8.super_IString.str._M_str;
      getOrMakeName(&local_68,local_70,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(local_48 + counter),(Index)NVar8.super_IString.str._M_len,name,
                    in_stack_ffffffffffffff28);
      if (usedNames._M_h._M_single_bucket != local_88) {
        operator_delete(usedNames._M_h._M_single_bucket,
                        (ulong)((long)&(local_88[0]._M_nxt)->_M_nxt + 1));
      }
      uVar4 = getU32LEB(this_00);
      pcVar6 = local_68.first.super_IString.str._M_str;
      sVar3 = local_68.first.super_IString.str._M_len;
      sig = getSignatureByTypeIndex(this_00,uVar4);
      HeapType::HeapType(&local_78,sig);
      HVar2.id = local_78.id;
      local_38._M_head_impl = (Tag *)operator_new(0x40);
      this_00 = local_50;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->type).id = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      ((local_38._M_head_impl)->type).id = 0x10;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = sVar3;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar6
      ;
      ((local_38._M_head_impl)->type).id = HVar2.id;
      ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = local_68.second;
      Module::addTag(local_50->wasm,
                     (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
      if (local_38._M_head_impl != (Tag *)0x0) {
        operator_delete(local_38._M_head_impl,0x40);
      }
      counter = counter + 1;
    } while (local_40 != counter);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d0);
  return;
}

Assistant:

void WasmBinaryReader::readTags() {
  size_t num = getU32LEB();
  auto numImports = wasm.tags.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : tagNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: tag index out of bounds in name section: " << name
                << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    getInt8(); // Reserved 'attribute' field
    auto [name, isExplicit] =
      getOrMakeName(tagNames, numImports + i, makeName("tag$", i), usedNames);
    auto typeIndex = getU32LEB();
    auto tag = Builder::makeTag(name, getSignatureByTypeIndex(typeIndex));
    tag->hasExplicitName = isExplicit;
    wasm.addTag(std::move(tag));
  }
}